

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::emitCommentFuncHeader(PrintC *this,Funcdata *fd)

{
  _Base_ptr p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  Comment label;
  string local_a8;
  Funcdata *local_88;
  Comment local_80;
  
  bVar2 = false;
  CommentSorter::setupHeader(&this->commsorter,0);
  p_Var3 = (this->commsorter).start._M_node;
  if (p_Var3 != (this->commsorter).opstop._M_node) {
    bVar2 = false;
    do {
      p_Var1 = p_Var3[1]._M_left;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      (this->commsorter).start._M_node = p_Var3;
      if (((this->super_PrintLanguage).head_comment_type & p_Var1->_M_color) != _S_red) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,p_Var1);
        bVar2 = true;
      }
      p_Var3 = (this->commsorter).start._M_node;
    } while (p_Var3 != (this->commsorter).opstop._M_node);
  }
  local_88 = fd;
  if (this->option_unplaced == true) {
    if (bVar2) {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    }
    CommentSorter::setupHeader(&this->commsorter,1);
    p_Var3 = (this->commsorter).start._M_node;
    if (p_Var3 == (this->commsorter).opstop._M_node) {
      bVar2 = false;
    }
    else {
      bVar2 = false;
      do {
        p_Var1 = p_Var3[1]._M_left;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        (this->commsorter).start._M_node = p_Var3;
        if (!bVar2) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Comments that could not be placed in the function body:",
                     "");
          Comment::Comment(&local_80,0x20,&fd->baseaddr,&fd->baseaddr,0,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.text._M_dataplus._M_p != &local_80.text.field_2) {
            operator_delete(local_80.text._M_dataplus._M_p);
          }
          bVar2 = true;
        }
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,1,p_Var1);
        p_Var3 = (this->commsorter).start._M_node;
      } while (p_Var3 != (this->commsorter).opstop._M_node);
    }
  }
  if ((this->super_PrintLanguage).field_0xff == '\x01') {
    if (bVar2) {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"DISPLAY WARNING: Type casts are NOT being printed","");
    Comment::Comment(&local_80,0x20,&local_88->baseaddr,&local_88->baseaddr,0,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[9])(this,0,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.text._M_dataplus._M_p != &local_80.text.field_2) {
      operator_delete(local_80.text._M_dataplus._M_p);
    }
    bVar2 = true;
  }
  if (bVar2) {
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  }
  return;
}

Assistant:

void PrintC::emitCommentFuncHeader(const Funcdata *fd)

{
  bool extralinebreak = false;
  commsorter.setupHeader(CommentSorter::header_basic);
  while(commsorter.hasNext()) {
    Comment *comm = commsorter.getNext();
    if ((head_comment_type & comm->getType())==0) continue;
    emitLineComment(0,comm);
    extralinebreak = true;
  }
  if (option_unplaced) {
    if (extralinebreak)
      emit->tagLine();
    extralinebreak = false;
    commsorter.setupHeader(CommentSorter::header_unplaced);
    while(commsorter.hasNext()) {
      Comment *comm = commsorter.getNext();
      if (!extralinebreak) {
	Comment label(Comment::warningheader,fd->getAddress(),fd->getAddress(),0,
		      "Comments that could not be placed in the function body:");
	emitLineComment(0,&label);
	extralinebreak = true;
      }
      emitLineComment(1,comm);
    }
  }
  if (option_nocasts) {
    if (extralinebreak)
      emit->tagLine();
    Comment comm(Comment::warningheader,fd->getAddress(),fd->getAddress(),0,
		 "DISPLAY WARNING: Type casts are NOT being printed");
    emitLineComment(0,&comm);
    extralinebreak = true;
  }
  if (extralinebreak)
    emit->tagLine();		// Extra linebreak if comment exists
}